

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

string * test::loadPrivateKey_abi_cxx11_(void)

{
  unit_test_log_t *puVar1;
  byte bVar2;
  bool bVar3;
  string *psVar4;
  lazy_ostream *prev;
  string *in_RDI;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_359;
  undefined1 local_358 [12];
  undefined1 local_348 [12];
  undefined1 local_331;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> local_320;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  istream_type local_2c8 [8];
  ifstream private_key_linux;
  path local_c0;
  path local_90;
  path local_70;
  path local_50;
  undefined1 local_30 [8];
  path pkf;
  string *pk_str;
  
  boost::filesystem::path::path
            (&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test"
            );
  boost::filesystem::path::path(&local_90,"data");
  boost::filesystem::operator/(&local_50,&local_70,&local_90);
  boost::filesystem::path::path(&local_c0,"private_key.rsa");
  boost::filesystem::operator/((path *)local_30,&local_50,&local_c0);
  boost::filesystem::path::~path(&local_c0);
  boost::filesystem::path::~path(&local_50);
  boost::filesystem::path::~path(&local_90);
  boost::filesystem::path::~path(&local_70);
  psVar4 = boost::filesystem::path::string_abi_cxx11_((path *)local_30);
  std::ifstream::ifstream(local_2c8,psVar4,8);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2d8,0x27,&local_2e8);
    bVar2 = std::ios::good();
    boost::test_tools::assertion_result::assertion_result(&local_300,(bool)(bVar2 & 1));
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_320,prev,(char (*) [16])"test file found");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_300,&local_320,&local_330,0x27,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>::
    ~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_300);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  local_331 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_348,local_2c8);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_358);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_348._0_8_;
  __beg._M_c = local_348._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_358._0_8_;
  __end._M_c = local_358._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)in_RDI,__beg,__end,&local_359);
  std::allocator<char>::~allocator(&local_359);
  local_331 = 1;
  std::ifstream::~ifstream(local_2c8);
  boost::filesystem::path::~path((path *)local_30);
  return in_RDI;
}

Assistant:

const std::string loadPrivateKey() {
	fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
	std::ifstream private_key_linux(pkf.string());
	BOOST_REQUIRE_MESSAGE(private_key_linux.good(), "test file found");
	const std::string pk_str((std::istreambuf_iterator<char>(private_key_linux)), std::istreambuf_iterator<char>());
	return pk_str;
}